

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

BOOL __thiscall Memory::Recycler::DoCollect(Recycler *this,CollectionFlags flags)

{
  Boolean BVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  size_t sVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  size_t sVar10;
  long lVar11;
  size_t *psVar12;
  size_t *psVar13;
  CollectionFlags CVar14;
  CollectionFlags flags_00;
  byte bVar15;
  CollectionState local_460 [204];
  size_t local_130 [11];
  size_t local_d8 [11];
  size_t *local_80;
  size_t *local_78;
  Recycler *local_70;
  size_t *local_68;
  size_t *local_60;
  size_t *local_58;
  size_t *local_50;
  ObservableValue<Memory::CollectionState> *local_48;
  undefined4 *local_40;
  CollectionFlags local_34;
  
  bVar15 = 0;
  this->hasIncompleteDoCollect = false;
  Verify(this,RecyclerPhase);
  VerifyFinalize(this);
  local_34 = flags;
  if ((this->recyclerFlagsTable->RecyclerPartialStress == true) &&
     ((this->recyclerFlagsTable->DumpObjectGraphOnCollect != false ||
      (this->dumpObjectOnceOnCollect == true)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xf35,
                       "(!GetRecyclerFlagsTable().DumpObjectGraphOnCollect && !this->dumpObjectOnceOnCollect)"
                       ,
                       "!GetRecyclerFlagsTable().DumpObjectGraphOnCollect && !this->dumpObjectOnceOnCollect"
                      );
    if (!bVar5) goto LAB_00711fa7;
    *puVar9 = 0;
  }
  flags_00 = local_34;
  CVar14 = local_34 & CollectMode_Partial;
  if ((CVar14 != 0) && (this->recyclerFlagsTable->RecyclerPartialStress == true)) {
    this->inPartialCollectMode = true;
    this->forcePartialScanStack = true;
  }
  if ((this->dumpObjectOnceOnCollect != false) ||
     (this->recyclerFlagsTable->DumpObjectGraphOnCollect == true)) {
    CVar14 = 0;
    DumpObjectGraph(this,(Param *)0x0);
    this->dumpObjectOnceOnCollect = false;
  }
  if ((this->collectionState).value != CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xf59,"(!this->CollectionInProgress())","!this->CollectionInProgress()");
    if (!bVar5) goto LAB_00711fa7;
    *puVar9 = 0;
    flags_00 = local_34;
  }
  if (this->backgroundFinishMarkCount == '\0') {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xf5b,"(this->backgroundFinishMarkCount == 0)",
                       "this->backgroundFinishMarkCount == 0");
    if (!bVar5) goto LAB_00711fa7;
    *puVar9 = 0;
    local_40 = puVar9;
  }
  local_48 = &this->collectionState;
  bVar6 = FinishDisposeObjects(this);
  bVar5 = CVar14 == 0;
  local_80 = &(this->collectionStats).markThruNewObjCount;
  local_50 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedBytes;
  local_68 = (this->collectionStats).heapBlockFreeByteCount;
  local_60 = (this->collectionStats).heapBlockCount;
  local_58 = (this->collectionStats).smallNonLeafHeapBlockPartialUnusedCount;
  local_78 = &(this->collectionStats).continueCollectAllocBytes;
  local_70 = this;
  do {
    puVar9 = local_40;
    if (local_48->value != CollectionStateNotCollecting) {
      if ((local_48->value >> 0xd & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xf6d,"(this->IsConcurrentState())","this->IsConcurrentState()");
        if (!bVar5) goto LAB_00711fa7;
        *puVar9 = 0;
      }
      if (bVar6 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xf6e,"(collected)","collected");
        if (!bVar5) goto LAB_00711fa7;
        *puVar9 = 0;
      }
      if ((flags_00 >> 0xe & 1) == 0) {
        return 1;
      }
      BVar8 = FinishConcurrentCollect(this,flags_00);
      return BVar8;
    }
    if (this->backgroundFinishMarkCount == '\0') {
      bVar7 = false;
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = local_40;
      *local_40 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xf77,"(this->backgroundFinishMarkCount == 0)",
                         "this->backgroundFinishMarkCount == 0");
      if (!bVar7) goto LAB_00711fa7;
      *puVar9 = 0;
      bVar7 = local_48->value == Collection_PreCollection;
      this = local_70;
    }
    this->collectionCount = this->collectionCount + 1;
    local_460[0] = Collection_PreCollection;
    pOVar2 = (this->collectionState).observer;
    if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) && (!bVar7)) {
      (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,local_460,local_48);
    }
    (this->collectionState).value = local_460[0];
    (**this->collectionWrapper->_vptr_RecyclerCollectionWrapper)
              (this->collectionWrapper,(ulong)flags_00);
    local_460[0] = CollectionStateNotCollecting;
    pOVar2 = (this->collectionState).observer;
    if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
       ((this->collectionState).value != CollectionStateNotCollecting)) {
      (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,local_460,local_48);
    }
    (this->collectionState).value = local_460[0];
    this->hasExhaustiveCandidate = false;
    sVar3 = (this->collectionStats).finalizeCount;
    memcpy(local_460,local_80,0x388);
    psVar12 = local_50;
    psVar13 = local_d8;
    for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
      *psVar13 = *psVar12;
      psVar12 = psVar12 + (ulong)bVar15 * -2 + 1;
      psVar13 = psVar13 + (ulong)bVar15 * -2 + 1;
    }
    memset(local_78,0,0x528);
    puVar9 = local_40;
    sVar10 = (this->autoHeap).uncollectedAllocBytes;
    (this->collectionStats).startCollectAllocBytes = sVar10;
    (this->collectionStats).startCollectNewPageCount = (this->autoHeap).uncollectedNewPageCount;
    (this->collectionStats).uncollectedNewPageCountPartialCollect =
         this->uncollectedNewPageCountPartialCollect;
    if (bVar5) {
      this->decommitOnFinish = true;
      if (this->inPartialCollectMode == true) {
        FinishPartialCollect(this,(RecyclerSweepManager *)0x0);
        sVar10 = (this->autoHeap).uncollectedAllocBytes;
        bVar6 = true;
      }
      flags_00 = local_34;
      puVar9 = local_40;
      BVar1 = this->recyclerFlagsTable->ForceBlockingConcurrentCollect;
      (this->autoHeap).lastUncollectedAllocBytes = sVar10;
      (this->autoHeap).uncollectedAllocBytes = 0;
      (this->autoHeap).uncollectedExternalBytes = 0;
      (this->autoHeap).uncollectedNewPageCount = 0;
      if (((local_34 >> 0x1c & 1) != 0) && (BVar1 == false)) {
        if ((local_34 >> 0xe & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0xfec,"(!forceInThread)","!forceInThread");
          if (!bVar5) goto LAB_00711fa7;
          *puVar9 = 0;
        }
        if (this->enableConcurrentMark == true) {
          PrintCollectTrace(this,ConcurrentMarkPhase,false,false);
          BVar8 = StartAsynchronousBackgroundMark(this);
          if (BVar8 != 0) goto LAB_00711f7e;
        }
        if (this->enableConcurrentSweep == true) {
          StartConcurrentSweepCollect(this);
          goto LAB_00711e57;
        }
      }
      if (((flags_00 >> 0xe & 1) == 0) && (this->enableConcurrentMark == true)) {
        BVar8 = CollectOnConcurrentThread(this);
        if (BVar8 == 0) {
LAB_00711f7e:
          return (uint)bVar6;
        }
      }
      else {
        CollectOnAllocatorThread(this);
      }
      (this->collectionParam).repeat = true;
    }
    else {
      if ((local_34 >> 0xe & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xfb3,"(!forceInThread)","!forceInThread");
        if (!bVar5) goto LAB_00711fa7;
        *puVar9 = 0;
      }
      flags_00 = local_34;
      (this->collectionStats).finalizeCount = sVar3;
      psVar12 = local_130;
      psVar13 = local_60;
      for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
        *psVar13 = *psVar12;
        psVar12 = psVar12 + (ulong)bVar15 * -2 + 1;
        psVar13 = psVar13 + (ulong)bVar15 * -2 + 1;
      }
      psVar12 = local_d8;
      psVar13 = local_68;
      for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
        *psVar13 = *psVar12;
        psVar12 = psVar12 + (ulong)bVar15 * -2 + 1;
        psVar13 = psVar13 + (ulong)bVar15 * -2 + 1;
      }
      psVar12 = local_130;
      psVar13 = local_58;
      for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
        *psVar13 = *psVar12;
        psVar12 = psVar12 + (ulong)bVar15 * -2 + 1;
        psVar13 = psVar13 + (ulong)bVar15 * -2 + 1;
      }
      psVar12 = local_d8;
      psVar13 = local_50;
      for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
        *psVar13 = *psVar12;
        psVar12 = psVar12 + (ulong)bVar15 * -2 + 1;
        psVar13 = psVar13 + (ulong)bVar15 * -2 + 1;
      }
      if ((this->enablePartialCollect != true) || (this->inPartialCollectMode == false)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0xfc1,"(enablePartialCollect && inPartialCollectMode)",
                           "enablePartialCollect && inPartialCollectMode");
        if (!bVar5) goto LAB_00711fa7;
        *puVar9 = 0;
      }
      bVar5 = PartialCollect(this,(bool)((byte)(flags_00 >> 0x1c) & 1));
      if (!bVar5) goto LAB_00711f7e;
    }
LAB_00711e57:
    puVar9 = local_40;
    if (this->inExhaustiveCollection != true) break;
    bVar5 = true;
    bVar6 = true;
  } while ((this->hasExhaustiveCandidate & 1U) != 0);
  if (local_48->value == CollectionStateNotCollecting) {
    EndCollection(this);
  }
  else if ((local_48->value >> 0xd & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1026,"(this->IsConcurrentState())","this->IsConcurrentState()");
    if (!bVar5) {
LAB_00711fa7:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  return 1;
}

Assistant:

BOOL
Recycler::DoCollect(CollectionFlags flags)
{
    // ExecuteRecyclerCollectionFunction may cause exception. In which case, we may trigger the assert
    // in SetupPostCollectionFlags because we didn't reset the inExhaustiveCollection variable if
    // an exception. We are not in DoCollect, there shouldn't be any more exception. Reset the flag
    DebugOnly(this->hasIncompleteDoCollect = false);

#ifdef RECYCLER_MEMORY_VERIFY
    this->Verify(Js::RecyclerPhase);
#endif
#ifdef RECYCLER_FINALIZE_CHECK
    this->VerifyFinalize();
#endif
#if ENABLE_PARTIAL_GC
    BOOL partial = flags & CollectMode_Partial;

#if DBG && defined(RECYCLER_DUMP_OBJECT_GRAPH)
    // Can't pass in RecyclerPartialStress and DumpObjectGraphOnCollect or call CollectGarbage with DumpObjectGraph
    if (GetRecyclerFlagsTable().RecyclerPartialStress) {
        Assert(!GetRecyclerFlagsTable().DumpObjectGraphOnCollect && !this->dumpObjectOnceOnCollect);
    } else if (GetRecyclerFlagsTable().DumpObjectGraphOnCollect || this->dumpObjectOnceOnCollect) {
        Assert(!GetRecyclerFlagsTable().RecyclerPartialStress);
    }
#endif

#ifdef RECYCLER_STRESS
    if (partial && GetRecyclerFlagsTable().RecyclerPartialStress)
    {
        this->inPartialCollectMode = true;
        this->forcePartialScanStack = true;
    }
#endif

#endif
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
    if (dumpObjectOnceOnCollect || GetRecyclerFlagsTable().DumpObjectGraphOnCollect)
    {
        DumpObjectGraph();
        dumpObjectOnceOnCollect = false;

#if ENABLE_PARTIAL_GC
        // Can't do a partial collect if DumpObjectGraph is set since it'll call FinishPartial
        // which will set inPartialCollectMode to false.
        partial = false;
#endif
    }
#endif
#if ENABLE_CONCURRENT_GC
    const bool concurrent = (flags & CollectMode_Concurrent) != 0;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;
#else
    const bool concurrent = false;
#endif

    // Flush the pending dispose objects first if dispose is allowed
    Assert(!this->CollectionInProgress());
#if ENABLE_CONCURRENT_GC
    Assert(this->backgroundFinishMarkCount == 0);
#endif

    bool collected = FinishDisposeObjects();

    do
    {
        INC_TIMESTAMP_FIELD(exhaustiveRepeatedCount);
        RECORD_TIMESTAMP(currentCollectionStartTime);
#ifdef NTBUILD
        this->telemetryBlock->currentCollectionStartProcessUsedBytes = PageAllocator::GetProcessUsedBytes();
#endif

#if ENABLE_CONCURRENT_GC
        // DisposeObject may call script again and start another GC, so we may still be in concurrent GC state

        if (this->CollectionInProgress())
        {
            Assert(this->IsConcurrentState());
            Assert(collected);

            if (forceInThread)
            {
                return this->FinishConcurrentCollect(flags);
            }

            return true;
        }
        Assert(this->backgroundFinishMarkCount == 0);
#endif

#ifdef ENABLE_JS_ETW
        this->collectionStartFlags = flags;

        if (flags == CollectOnScriptIdle)
        {
            collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_IdleCollect;
        }

        const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
        const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
        if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason) && (flags & CollectHeuristic_Mask))
        {
            if (timedIfScriptActive)
            {
                collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_TimeAndAllocSizeIfScriptActive_Heuristic;
            }
            else if (timedIfInScript)
            {
                collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_TimeAndAllocSizeIfInScript_Heuristic;
            }
            else
            {
                collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_TimeAndAllocSize_Heuristic;
            }
        }

        if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
        {
            this->collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_NoHeuristic;
        }
#endif

#if DBG || defined RECYCLER_TRACE
        collectionCount++;
#endif
        this->SetCollectionState(Collection_PreCollection);
        collectionWrapper->PreCollectionCallBack(flags);
        this->SetCollectionState(CollectionStateNotCollecting);

        hasExhaustiveCandidate = false;         // reset the candidate detection

#ifdef RECYCLER_STATS
#if ENABLE_PARTIAL_GC
        RecyclerCollectionStats oldCollectionStats = collectionStats;
#endif
        memset(&collectionStats, 0, sizeof(RecyclerCollectionStats));
        this->collectionStats.startCollectAllocBytes = autoHeap.uncollectedAllocBytes;
#if ENABLE_PARTIAL_GC
        this->collectionStats.startCollectNewPageCount = autoHeap.uncollectedNewPageCount;
        this->collectionStats.uncollectedNewPageCountPartialCollect = this->uncollectedNewPageCountPartialCollect;
#endif
#endif

#if ENABLE_PARTIAL_GC
        if (partial)
        {
#if ENABLE_CONCURRENT_GC
            Assert(!forceInThread);
#endif
#ifdef RECYCLER_STATS
            // We are only doing a partial GC, copy some old stats
            collectionStats.finalizeCount = oldCollectionStats.finalizeCount;
            memcpy(collectionStats.heapBlockCount, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount));
            memcpy(collectionStats.heapBlockFreeByteCount, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes));
            memcpy(collectionStats.smallNonLeafHeapBlockPartialUnusedCount, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedCount));
            memcpy(collectionStats.smallNonLeafHeapBlockPartialUnusedBytes, oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes,
                sizeof(oldCollectionStats.smallNonLeafHeapBlockPartialUnusedBytes));
#endif
            Assert(enablePartialCollect && inPartialCollectMode);

            if (!this->PartialCollect(concurrent))
            {
                return collected;
            }
            // This disable partial if we do a repeated exhaustive GC
            partial = false;
            collected = true;
            continue;
        }

        // Not doing partial collect, we should decommit on finish collect
        decommitOnFinish = true;

        if (inPartialCollectMode)
        {
            // finish the partial collect first
            FinishPartialCollect();

            // Old heap block with free object is made available, count that as being collected
            collected = true;
            // PARTIAL-GC-CONSIDER: should we just pretend we did a GC, since we have made the free listed object
            // available to be used, instead of starting off another GC?
        }
#endif

#if ENABLE_CONCURRENT_GC

        bool skipConcurrent = false;
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS

        // If the below flag is passed in, skip doing a non-blocking concurrent collect. Instead,
        // we will do a blocking concurrent collect, which is basically an in-thread GC
        skipConcurrent = GetRecyclerFlagsTable().ForceBlockingConcurrentCollect;
#endif

        // We are about to start a collection. Reset our heuristic counters now, so that
        // any allocations that occur during concurrent collection count toward the next collection's threshold.
        ResetHeuristicCounters();

        if (concurrent && !skipConcurrent)
        {
            Assert(!forceInThread);
            if (enableConcurrentMark)
            {
                if (StartBackgroundMarkCollect())
                {
                    // Tell the caller whether we have finish a collection and there maybe free object to reuse
                    return collected;
                }

                // Either ResetWriteWatch failed or the thread service failed
                // So concurrent mark is disabled, at least for now
            }

            if (enableConcurrentSweep)
            {
                if (StartConcurrentSweepCollect())
                {
                    collected = true;
                    continue;
                }

                // out of memory during collection
                return collected;
            }

            // concurrent collection failed, default back to non-concurrent collection
        }

        if (!forceInThread && enableConcurrentMark)
        {
            if (!CollectOnConcurrentThread())
            {
                // time out or out of memory during collection
                return collected;
            }
         }
        else
#endif
        {
            if (!CollectOnAllocatorThread())
            {
                // out of memory during collection
                return collected;
            }
        }

        collected = true;
#ifdef RECYCLER_TRACE
        collectionParam.repeat = true;
#endif
    }
    while (this->NeedExhaustiveRepeatCollect());

#if ENABLE_CONCURRENT_GC
    // DisposeObject may call script again and start another GC, so we may still be in concurrent GC state

    if (this->CollectionInProgress())
    {
        Assert(this->IsConcurrentState());
        Assert(collected);
        return true;
    }
#endif

    EndCollection();

    // Tell the caller whether we have finish a collection and there maybe free object to reuse
    return collected;
}